

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsViewPrivate::~QGraphicsViewPrivate(QGraphicsViewPrivate *this)

{
  Data *pDVar1;
  
  *(undefined ***)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
       = &PTR__QGraphicsViewPrivate_00814770;
  QRegion::~QRegion(&this->exposedRegion);
  QRegion::~QRegion(&this->dirtyRegion);
  QCursor::~QCursor(&this->originalCursor);
  QRegion::~QRegion(&this->backgroundPixmapExposed);
  QPixmap::~QPixmap(&this->backgroundPixmap);
  QBrush::~QBrush(&this->foregroundBrush);
  QBrush::~QBrush(&this->backgroundBrush);
  QArrayDataPointer<QStyleOptionGraphicsItem>::~QArrayDataPointer(&(this->styleOptions).d);
  pDVar1 = (this->scene).wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      pDVar1 = (this->scene).wp.d;
      if (pDVar1 == (Data *)0x0) {
        pDVar1 = (Data *)0x0;
      }
      operator_delete(pDVar1);
    }
  }
  if ((this->lastMouseEvent).m_engaged == true) {
    QMouseEvent::~QMouseEvent((QMouseEvent *)&this->lastMouseEvent);
    (this->lastMouseEvent).m_engaged = false;
  }
  QAbstractScrollAreaPrivate::~QAbstractScrollAreaPrivate(&this->super_QAbstractScrollAreaPrivate);
  return;
}

Assistant:

QGraphicsViewPrivate::~QGraphicsViewPrivate()
{
}